

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O3

void * alsa_run_thread(void *context)

{
  pthread_mutex_t *__mutex;
  snd_pcm_uframes_t *psVar1;
  __suseconds_t *p_Var2;
  float fVar3;
  long lVar4;
  cubeb_stream_conflict1 *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  snd_pcm_stream_t sVar9;
  snd_pcm_state_t sVar10;
  stream_state sVar11;
  long lVar12;
  undefined4 *puVar13;
  ulong uVar14;
  snd_pcm_uframes_t sVar15;
  snd_pcm_uframes_t sVar16;
  snd_pcm_uframes_t sVar17;
  ssize_t sVar18;
  snd_pcm_uframes_t sVar19;
  uint uVar20;
  nfds_t nVar21;
  cubeb_state cVar22;
  size_t sVar23;
  ulong uVar24;
  float *b;
  pthread_mutex_t *__mutex_00;
  long lVar25;
  cubeb_stream_conflict1 *pcVar26;
  char *pcVar27;
  char *pcVar28;
  char dummy;
  unsigned_short revents;
  char *local_58;
  undefined1 local_49;
  char *local_48;
  pthread_mutex_t *local_40;
  unsigned_short local_32;
  
  __mutex_00 = (pthread_mutex_t *)((long)context + 0x18);
  local_40 = __mutex_00;
  do {
    pthread_mutex_lock(__mutex_00);
    if (*(int *)((long)context + 0xd0) != 0) {
      sVar23 = 1;
      lVar12 = 0;
      do {
        lVar25 = *(long *)((long)context + lVar12 * 8 + 0x40);
        if ((lVar25 != 0) && (*(undefined8 *)(lVar25 + 0xc0) = 0, *(int *)(lVar25 + 0xb0) == 1)) {
          sVar23 = sVar23 + *(long *)(lVar25 + 200);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
      free(*(void **)((long)context + 0xc0));
      puVar13 = (undefined4 *)calloc(sVar23,8);
      *(undefined4 **)((long)context + 0xc0) = puVar13;
      if (puVar13 == (undefined4 *)0x0) {
        __assert_fail("ctx->fds",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                      ,0xff,"void rebuild(cubeb *)");
      }
      *(size_t *)((long)context + 200) = sVar23;
      *puVar13 = *(undefined4 *)((long)context + 0xd8);
      *(undefined2 *)(puVar13 + 1) = 9;
      lVar12 = 1;
      lVar25 = 0;
      do {
        lVar4 = *(long *)((long)context + lVar25 * 8 + 0x40);
        if ((lVar4 != 0) && (*(int *)(lVar4 + 0xb0) == 1)) {
          memcpy(puVar13 + lVar12 * 2,*(void **)(lVar4 + 0xb8),*(long *)(lVar4 + 200) << 3);
          puVar13 = *(undefined4 **)((long)context + 0xc0);
          *(undefined4 **)(lVar4 + 0xc0) = puVar13 + lVar12 * 2;
          lVar12 = lVar12 + *(long *)(lVar4 + 200);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x10);
      *(undefined4 *)((long)context + 0xd0) = 0;
    }
    iVar8 = 1000;
    lVar12 = 0;
    do {
      lVar25 = *(long *)((long)context + lVar12 * 8 + 0x40);
      if ((lVar25 != 0) && (*(int *)(lVar25 + 0xb0) == 2)) {
        iVar7 = timeval_to_relative_ms((timeval *)(lVar25 + 0xd0));
        iVar6 = iVar7;
        if (iVar8 < iVar7) {
          iVar6 = iVar8;
        }
        if (-1 < iVar7) {
          iVar8 = iVar6;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x10);
    pthread_mutex_unlock(__mutex_00);
    iVar8 = poll(*(pollfd **)((long)context + 0xc0),*(nfds_t *)((long)context + 200),iVar8);
    pthread_mutex_lock(__mutex_00);
    if (iVar8 < 1) {
      if (iVar8 == 0) {
        lVar12 = 0;
        do {
          pcVar5 = *(cubeb_stream_conflict1 **)((long)context + lVar12 * 8 + 0x40);
          if (pcVar5 != (cubeb_stream_conflict1 *)0x0) {
            sVar11 = pcVar5->state;
            if (sVar11 == DRAINING) {
              iVar8 = timeval_to_relative_ms(&pcVar5->drain_timeout);
              if (0 < iVar8) {
                sVar11 = pcVar5->state;
                goto LAB_0010941c;
              }
              cVar22 = CUBEB_STATE_DRAINED;
              sVar11 = INACTIVE;
            }
            else {
LAB_0010941c:
              if ((sVar11 != RUNNING) ||
                 (iVar8 = timeval_to_relative_ms(&pcVar5->last_activity), -0x2711 < iVar8))
              goto LAB_0010945c;
              cVar22 = CUBEB_STATE_ERROR;
              sVar11 = ERROR;
            }
            alsa_set_stream_state(pcVar5,sVar11);
            (*pcVar5->state_callback)(pcVar5,pcVar5->user_ptr,cVar22);
          }
LAB_0010945c:
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x10);
      }
    }
    else {
      if (((*(byte *)(*(long *)((long)context + 0xc0) + 6) & 1) != 0) &&
         (read(*(int *)((long)context + 0xd8),&local_49,1), *(int *)((long)context + 0xd4) != 0)) {
        pthread_mutex_unlock(__mutex_00);
        return (void *)0x0;
      }
      lVar12 = 0;
      do {
        pcVar5 = *(cubeb_stream_conflict1 **)((long)context + lVar12 * 8 + 0x40);
        if ((((pcVar5 != (cubeb_stream_conflict1 *)0x0) && (pcVar5->state == RUNNING)) &&
            (pcVar5->fds != (pollfd *)0x0)) && (pcVar5->nfds != 0)) {
          nVar21 = 0;
LAB_00108e55:
          if (pcVar5->fds[nVar21].revents == 0) goto code_r0x00108e5d;
          alsa_set_stream_state(pcVar5,PROCESSING);
          pthread_mutex_unlock(local_40);
          __mutex = &pcVar5->mutex;
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          (*cubeb_snd_pcm_poll_descriptors_revents)
                    (pcVar5->pcm,pcVar5->fds,(uint)pcVar5->nfds,&local_32);
          uVar14 = (*cubeb_snd_pcm_avail_update)(pcVar5->pcm);
          if (uVar14 == 0) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            local_58._0_4_ = RUNNING;
            goto LAB_001093c7;
          }
          uVar24 = pcVar5->buffer_size;
          if (uVar24 < (uVar14 & 0xffffffff)) {
            uVar14 = uVar24;
          }
          sVar9 = pcVar5->stream_type;
          sVar15 = uVar14;
          if ((sVar9 == SND_PCM_STREAM_CAPTURE) && (0 < (long)uVar14)) {
            sVar15 = pcVar5->bufframes;
            if (uVar24 < sVar15 + uVar14) {
              pcVar5->bufframes = 0;
              sVar15 = 0;
            }
            sVar15 = (*cubeb_snd_pcm_readi)(pcVar5->pcm,pcVar5->buffer + sVar15,uVar14);
            if (-1 < (long)sVar15) {
              pcVar5->bufframes = pcVar5->bufframes + sVar15;
              pcVar5->stream_position = pcVar5->stream_position + sVar15;
              gettimeofday((timeval *)&pcVar5->last_activity,(__timezone_ptr_t)0x0);
              sVar15 = uVar14;
            }
            sVar9 = pcVar5->stream_type;
          }
          sVar19 = sVar15;
          if ((sVar9 == SND_PCM_STREAM_CAPTURE) && (sVar17 = pcVar5->bufframes, sVar17 != 0)) {
            pcVar26 = pcVar5->other_stream;
            if (pcVar26 == (cubeb_stream_conflict1 *)0x0) {
              local_58 = (char *)0x0;
              pcVar26 = pcVar5;
            }
            else {
              uVar14 = pcVar26->bufframes;
              sVar16 = pcVar26->buffer_size - uVar14;
              if (pcVar26->buffer_size < uVar14 || sVar16 == 0) goto LAB_00109047;
              local_58 = pcVar26->buffer + uVar14;
              if ((long)sVar16 <= (long)sVar17) {
                sVar17 = sVar16;
              }
            }
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            sVar17 = (*pcVar5->data_callback)
                               (pcVar26,pcVar5->user_ptr,pcVar5->buffer,local_58,sVar17);
            pthread_mutex_lock((pthread_mutex_t *)__mutex);
            sVar19 = sVar17;
            if (-1 < (long)sVar17) {
              pcVar27 = pcVar5->buffer;
              sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,sVar17);
              pcVar28 = pcVar5->buffer;
              sVar23 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,pcVar5->bufframes - sVar17);
              memmove(pcVar28,pcVar27 + sVar18,sVar23);
              pcVar5->bufframes = pcVar5->bufframes - sVar17;
              sVar19 = sVar15;
              if (pcVar5->other_stream != (cubeb_stream_conflict1 *)0x0) {
                psVar1 = &pcVar5->other_stream->bufframes;
                *psVar1 = *psVar1 + sVar17;
              }
            }
          }
LAB_00109047:
          local_58._0_4_ = RUNNING;
          sVar15 = sVar19;
          if (pcVar5->stream_type == SND_PCM_STREAM_PLAYBACK) {
            sVar17 = pcVar5->bufframes;
            sVar16 = sVar19 - sVar17;
            if (sVar16 != 0 && (long)sVar17 <= (long)sVar19) {
              pcVar26 = pcVar5->other_stream;
              if (pcVar26 == (cubeb_stream_conflict1 *)0x0) {
                pcVar27 = (char *)0x0;
              }
              else {
                if (pcVar26->bufframes == 0) goto LAB_00109179;
                pcVar27 = pcVar26->buffer;
              }
              local_48 = pcVar5->buffer;
              sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,sVar17);
              if ((pcVar5->other_stream != (cubeb_stream_conflict1 *)0x0) &&
                 (sVar15 = pcVar5->other_stream->bufframes, (long)sVar15 <= (long)sVar16)) {
                sVar16 = sVar15;
              }
              pcVar28 = local_48 + sVar18;
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              sVar17 = (*pcVar5->data_callback)(pcVar5,pcVar5->user_ptr,pcVar27,pcVar28,sVar16);
              pthread_mutex_lock((pthread_mutex_t *)__mutex);
              sVar15 = sVar17;
              if (-1 < (long)sVar17) {
                pcVar5->bufframes = pcVar5->bufframes + sVar17;
                pcVar26 = pcVar5->other_stream;
                sVar15 = sVar19;
                if (pcVar26 != (cubeb_stream_conflict1 *)0x0) {
                  pcVar27 = pcVar26->buffer;
                  sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar26->pcm,sVar17);
                  local_48 = pcVar26->buffer;
                  sVar23 = (*cubeb_snd_pcm_frames_to_bytes)
                                     (pcVar26->pcm,pcVar26->bufframes - sVar17);
                  memmove(local_48,pcVar27 + sVar18,sVar23);
                  pcVar26->bufframes = pcVar26->bufframes - sVar17;
                }
              }
            }
LAB_00109179:
            if (pcVar5->stream_type == SND_PCM_STREAM_PLAYBACK) {
              sVar19 = pcVar5->bufframes;
              lVar25 = sVar15 - sVar19;
              if (lVar25 != 0 && (long)sVar19 <= (long)sVar15) {
                uVar20 = (pcVar5->params).rate;
                pcVar27 = pcVar5->buffer;
                sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,sVar19);
                sVar23 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,lVar25);
                memset(pcVar27 + sVar18,0,sVar23);
                pcVar5->bufframes = sVar15;
                if ((pcVar5->other_stream == (cubeb_stream_conflict1 *)0x0) ||
                   (local_58._0_4_ = RUNNING, pcVar5->other_stream->bufframes != 0)) {
                  uVar24 = (ulong)(((double)lVar25 / (double)uVar20) * 1000.0);
                  gettimeofday((timeval *)&pcVar5->drain_timeout,(__timezone_ptr_t)0x0);
                  uVar14 = uVar24 & 0xffffffff;
                  (pcVar5->drain_timeout).tv_sec = (pcVar5->drain_timeout).tv_sec + uVar14 / 1000;
                  p_Var2 = &(pcVar5->drain_timeout).tv_usec;
                  *p_Var2 = *p_Var2 + (ulong)(uint)(((int)uVar24 + (int)(uVar14 / 1000) * -1000) *
                                                   1000);
                  local_58._0_4_ = DRAINING;
                }
              }
            }
          }
          if ((pcVar5->stream_type != SND_PCM_STREAM_PLAYBACK) || ((long)sVar15 < 1))
          goto LAB_00109354;
          uVar20 = (pcVar5->params).channels;
          uVar14 = sVar15 * uVar20;
          pcVar27 = pcVar5->buffer;
          if ((pcVar5->params).format == CUBEB_SAMPLE_FLOAT32LE) {
            if (uVar20 != 0) {
              uVar20 = 1;
              uVar24 = 0;
              do {
                *(float *)(pcVar27 + uVar24 * 4) = pcVar5->volume * *(float *)(pcVar27 + uVar24 * 4)
                ;
                uVar24 = (ulong)uVar20;
                uVar20 = uVar20 + 1;
              } while (uVar24 <= uVar14 && uVar14 - uVar24 != 0);
            }
          }
          else if (uVar20 != 0) {
            fVar3 = pcVar5->volume;
            uVar20 = 1;
            uVar24 = 0;
            do {
              *(short *)(pcVar27 + uVar24 * 2) =
                   (short)(int)((float)(int)*(short *)(pcVar27 + uVar24 * 2) * fVar3);
              uVar24 = (ulong)uVar20;
              uVar20 = uVar20 + 1;
            } while (uVar24 <= uVar14 && uVar14 - uVar24 != 0);
          }
          sVar19 = (*cubeb_snd_pcm_writei)(pcVar5->pcm,pcVar27,sVar15);
          if ((long)sVar19 < 0) {
LAB_00109362:
            iVar8 = (*cubeb_snd_pcm_recover)(pcVar5->pcm,(int)sVar19,0);
            if ((-1 < iVar8) &&
               (((pcVar5->stream_type != SND_PCM_STREAM_CAPTURE ||
                 (sVar10 = (*cubeb_snd_pcm_state)(pcVar5->pcm), sVar10 != SND_PCM_STATE_PREPARED))
                || (iVar8 = (*cubeb_snd_pcm_start)(pcVar5->pcm), -1 < iVar8)))) goto LAB_0010939c;
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            (*pcVar5->state_callback)(pcVar5,pcVar5->user_ptr,CUBEB_STATE_ERROR);
            local_58._0_4_ = ERROR;
          }
          else {
            pcVar27 = pcVar5->buffer;
            sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,sVar19);
            pcVar28 = pcVar5->buffer;
            sVar23 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,pcVar5->bufframes - sVar19);
            memmove(pcVar28,pcVar27 + sVar18,sVar23);
            pcVar5->bufframes = pcVar5->bufframes - sVar19;
            pcVar5->stream_position = pcVar5->stream_position + sVar19;
            gettimeofday((timeval *)&pcVar5->last_activity,(__timezone_ptr_t)0x0);
LAB_00109354:
            sVar19 = sVar15;
            if ((long)sVar15 < 0) goto LAB_00109362;
LAB_0010939c:
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
LAB_001093c7:
          pthread_mutex_lock(local_40);
          alsa_set_stream_state(pcVar5,(stream_state)local_58);
        }
LAB_001093db:
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
    }
    __mutex_00 = local_40;
    pthread_mutex_unlock(local_40);
  } while( true );
code_r0x00108e5d:
  nVar21 = nVar21 + 1;
  if (pcVar5->nfds == nVar21) goto LAB_001093db;
  goto LAB_00108e55;
}

Assistant:

static void *
alsa_run_thread(void * context)
{
  cubeb * ctx = context;
  int r;

  do {
    r = alsa_run(ctx);
  } while (r >= 0);

  return NULL;
}